

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Data_Query_PDU::Decode(Data_Query_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT32 *T;
  pointer puVar1;
  iterator iVar2;
  KUINT16 KVar3;
  uint uVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  ushort uVar6;
  KUINT32 tmp;
  KString local_58;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (0x27 < iVar5 + (uint)KVar3) {
    puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    puVar1 = (this->m_vVariableDatum).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RequestID);
    (*(this->m_TimeInterval).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TimeInterval,stream)
    ;
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumFixedDatum);
    T = &this->m_ui32NumVariableDatum;
    KDataStream::Read<unsigned_int>(stream,T);
    local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._4_4_ << 0x20);
    if (this->m_ui32NumFixedDatum != 0) {
      local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vFixedDatum;
      uVar6 = 1;
      do {
        KDataStream::Read<unsigned_int>(stream,(uint *)&local_58);
        iVar2._M_current =
             (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,iVar2,(uint *)&local_58);
        }
        else {
          *iVar2._M_current = (uint)local_58._M_dataplus._M_p;
          (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar4 = (uint)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar4 < this->m_ui32NumFixedDatum);
    }
    if (*T != 0) {
      uVar6 = 1;
      do {
        KDataStream::Read<unsigned_int>(stream,(uint *)&local_58);
        iVar2._M_current =
             (this->m_vVariableDatum).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vVariableDatum,
                     iVar2,(uint *)&local_58);
        }
        else {
          *iVar2._M_current = (uint)local_58._M_dataplus._M_p;
          (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar4 = (uint)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar4 < *T);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
  KException::KException(this_00,&local_58,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Data_Query_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DATA_QUERY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vFixedDatum.clear();
    m_vVariableDatum.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RequestID
           >> KDIS_STREAM m_TimeInterval
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    KUINT32 tmp = 0;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        stream >> tmp;
        m_vFixedDatum.push_back( tmp );
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        stream >> tmp;
        m_vVariableDatum.push_back( tmp );
    }
}